

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::clear(BVHNSubdivPatch1MBlurBuilderSAH<4> *this)

{
  size_t sVar1;
  PrimRefMB *ptr;
  MemoryMonitorInterface *pMVar2;
  
  sVar1 = (this->primsMB).size_alloced;
  ptr = (this->primsMB).items;
  if (ptr != (PrimRefMB *)0x0) {
    if (sVar1 * 0x50 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar1 * 0x50,(this->primsMB).alloc.hugepages);
    }
  }
  if (sVar1 != 0) {
    pMVar2 = (this->primsMB).alloc.device;
    (**pMVar2->_vptr_MemoryMonitorInterface)(pMVar2,sVar1 * -0x50,1);
  }
  (this->primsMB).size_active = 0;
  (this->primsMB).size_alloced = 0;
  (this->primsMB).items = (PrimRefMB *)0x0;
  return;
}

Assistant:

void clear() {
        primsMB.clear();
      }